

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O2

sexp_conflict sexp_current_directory_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n)

{
  char *pcVar1;
  char *__buf;
  sexp_conflict psVar2;
  uint uVar3;
  size_t __size;
  sexp_gc_var_t local_140;
  sexp_conflict local_130;
  char buf0 [256];
  
  local_140.var = &local_130;
  local_130 = (sexp_conflict)0x43e;
  local_140.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_140;
  __buf = buf0;
  __size = 0x100;
  do {
    uVar3 = (uint)__size;
    pcVar1 = getcwd(__buf,__size);
    if (pcVar1 != (char *)0x0) {
      psVar2 = (sexp_conflict)sexp_c_string(ctx,__buf,0xffffffffffffffff);
      if (uVar3 != 0x100) {
LAB_00104048:
        free(__buf);
      }
      (ctx->value).context.saves = local_140.next;
      return psVar2;
    }
    if (0xa00000 < uVar3) {
      psVar2 = (sexp_conflict)
               sexp_user_exception(ctx,self,"exceeded max auto-expand len in current-directory",
                                   0x23e);
      goto LAB_00104048;
    }
    if (uVar3 != 0x100) {
      free(__buf);
    }
    __size = (size_t)(uVar3 * 2);
    __buf = (char *)calloc(__size,1);
  } while( true );
}

Assistant:

sexp sexp_current_directory_stub (sexp ctx, sexp self, sexp_sint_t n) {
  char *err;
  char buf0[256];
  int len0;
  char *tmp0;
  sexp res;
  sexp_gc_var1(res0);
  sexp_gc_preserve1(ctx, res0);
  len0 = 256;
  tmp0 = buf0;
 loop:
  err = getcwd(tmp0, len0);
  if (!err) {
  if (len0 > 10485760) {
    res = sexp_user_exception(ctx, self, "exceeded max auto-expand len in current-directory", SEXP_NULL);
} else {
  if (len0 != 256)
    free(tmp0);
  len0 *= 2;
  tmp0 = (char*) calloc(len0, sizeof(tmp0[0]));
  goto loop;
}
  } else {
  res0 = sexp_c_string(ctx, tmp0, -1);
  res = res0;
  }
  if (len0 != 256)
    free(tmp0);
  sexp_gc_release1(ctx);
  return res;
}